

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

uint8_t * plot_tile(tgestate_t *state,tileindex_t tile_index,supertileindex_t *maptiles,uint8_t *scr
                   )

{
  byte bVar1;
  uint8_t iters;
  uint8_t *dst;
  tilerow_t *src;
  tile_t *tileset;
  supertileindex_t supertileindex;
  uint8_t *scr_local;
  supertileindex_t *maptiles_local;
  tileindex_t tile_index_local;
  tgestate_t *state_local;
  
  bVar1 = *maptiles;
  if (bVar1 < 0x2d) {
    tileset = exterior_tiles;
  }
  else if ((bVar1 < 0x8b) || (0xcb < bVar1)) {
    tileset = exterior_tiles + 0x91;
  }
  else {
    tileset = exterior_tiles + 0x16d;
  }
  iters = '\b';
  dst = scr;
  src = tileset[tile_index].row;
  do {
    *dst = *src;
    dst = dst + state->columns;
    iters = iters + 0xff;
    src = src + 1;
  } while (iters != '\0');
  return scr + 1;
}

Assistant:

uint8_t *plot_tile(tgestate_t             *state,
                   tileindex_t             tile_index,
                   const supertileindex_t *maptiles,
                   uint8_t                *scr)
{
  supertileindex_t  supertileindex; /* was A' */
  const tile_t     *tileset;        /* was BC' */
  const tilerow_t  *src;            /* was DE' */
  uint8_t          *dst;            /* was HL' */
  uint8_t           iters;          /* was A */

  assert(state != NULL);
  ASSERT_MAP_BUF_PTR_VALID(maptiles);
  ASSERT_WINDOW_BUF_PTR_VALID(scr, 0);

  supertileindex = *maptiles; /* get supertile index */
  assert(supertileindex < supertileindex__LIMIT);

  /* Supertiles 44 and lower         use tiles   0..249 (249 tile span) */
  /* Supertiles 45..138 and 204..218 use tiles 145..400 (255 tile span) */
  /* Supertiles 139..203             use tiles 365..570 (205 tile span) */

  if (supertileindex <= 44)
  {
    assert(tile_index <= 249);
    tileset = &exterior_tiles[0];
  }
  else if (supertileindex <= 138 || supertileindex >= 204)
  {
    /* assert(tile_index <= 255) is always true */
    tileset = &exterior_tiles[145];
  }
  else
  {
    assert(tile_index <= 205);
    tileset = &exterior_tiles[365];
  }

  src = &tileset[tile_index].row[0];
  dst = scr;
  iters = 8;
  do
  {
    ASSERT_WINDOW_BUF_PTR_VALID(dst, 0);
    *dst = *src++;
    dst += state->columns; /* stride */ // FUTURE: Hoist.
  }
  while (--iters);

  return scr + 1;
}